

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_schnorrsig.cpp
# Opt level: O0

void __thiscall SchnorrSig_GetPrivkey_Test::TestBody(SchnorrSig_GetPrivkey_Test *this)

{
  bool bVar1;
  char *message;
  AssertHelper local_c0;
  Message local_b8;
  ByteData local_b0;
  string local_98;
  undefined1 local_78 [8];
  AssertionResult gtest_ar;
  Privkey privkey;
  allocator local_31;
  undefined1 local_30 [8];
  string expected_privkey;
  SchnorrSig_GetPrivkey_Test *this_local;
  
  expected_privkey.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_30,"5077c4a8b8dca28963d772a94f5f0ddf598e1c47c137f91933274c7c3edadce8",
             &local_31);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  cfd::core::SchnorrSignature::GetPrivkey((Privkey *)&gtest_ar.message_,&::signature);
  cfd::core::Privkey::GetData(&local_b0,(Privkey *)&gtest_ar.message_);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_98,&local_b0);
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            ((EqHelper<false> *)local_78,"expected_privkey","privkey.GetData().GetHex()",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30,&local_98
            );
  std::__cxx11::string::~string((string *)&local_98);
  cfd::core::ByteData::~ByteData(&local_b0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_78);
  if (!bVar1) {
    testing::Message::Message(&local_b8);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_78);
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_schnorrsig.cpp"
               ,0x53,message);
    testing::internal::AssertHelper::operator=(&local_c0,&local_b8);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    testing::Message::~Message(&local_b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_78);
  cfd::core::Privkey::~Privkey((Privkey *)&gtest_ar.message_);
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

TEST(SchnorrSig, GetPrivkey) {
  std::string expected_privkey =
      "5077c4a8b8dca28963d772a94f5f0ddf598e1c47c137f91933274c7c3edadce8";

  auto privkey = signature.GetPrivkey();

  EXPECT_EQ(expected_privkey, privkey.GetData().GetHex());
}